

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O2

void __thiscall BitField_Max_Test::BitField_Max_Test(BitField_Max_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0020e270;
  return;
}

Assistant:

TEST (BitField, Max) {
    EXPECT_EQ ((pstore::bit_field<std::uint8_t, 0, 1>::max ()), 1U);
    EXPECT_EQ ((pstore::bit_field<std::uint16_t, 0, 1>::max ()), 1U);
    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 1>::max ()), 1U);
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 1>::max ()), 1U);

    EXPECT_EQ ((pstore::bit_field<std::uint8_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint16_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());

    EXPECT_EQ ((pstore::bit_field<std::uint16_t, 0, 16>::max ()),
               std::numeric_limits<std::uint16_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 16>::max ()),
               std::numeric_limits<std::uint16_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 16>::max ()),
               std::numeric_limits<std::uint16_t>::max ());

    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 32>::max ()),
               std::numeric_limits<std::uint32_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 32>::max ()),
               std::numeric_limits<std::uint32_t>::max ());

    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 64>::max ()),
               std::numeric_limits<std::uint64_t>::max ());
}